

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filterintra_sse4.c
# Opt level: O1

void av1_filter_intra_predictor_sse4_1
               (uint8_t *dst,ptrdiff_t stride,TX_SIZE tx_size,uint8_t *above,uint8_t *left,int mode)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  uint uVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  int iVar14;
  uint7 uVar15;
  long lVar16;
  uint8_t *puVar17;
  undefined7 in_register_00000011;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint *puVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  short sVar28;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  short sVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  
  auVar27 = *(undefined1 (*) [16])av1_filter_intra_taps[mode];
  auVar42 = *(undefined1 (*) [16])(av1_filter_intra_taps[mode] + 2);
  auVar1 = *(undefined1 (*) [16])(av1_filter_intra_taps[mode] + 4);
  auVar2 = *(undefined1 (*) [16])(av1_filter_intra_taps[mode] + 6);
  if ((0x2021UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
    uVar26 = (ulong)(uint)((int)CONCAT71(in_register_00000011,tx_size) << 2);
    uVar3 = *(uint *)left;
    auVar29._8_4_ = uVar3;
    auVar29._0_8_ = *(undefined8 *)(above + -1);
    auVar29._12_4_ = 0;
    auVar30 = pshufb(auVar29,_DAT_0056aaf0);
    auVar43 = pmaddubsw(auVar30,auVar27);
    auVar49 = pmaddubsw(auVar30,auVar42);
    auVar43 = phaddw(auVar43,auVar49);
    iVar4 = *(int *)((long)tx_size_wide + uVar26);
    lVar23 = (long)iVar4;
    auVar43 = phaddw(auVar43,auVar43);
    uVar5 = *(uint *)((long)tx_size_high + uVar26);
    auVar49 = pmaddubsw(auVar30,auVar1);
    auVar30 = pmaddubsw(auVar30,auVar2);
    auVar49 = phaddw(auVar49,auVar30);
    auVar30 = pmovsxbw(auVar30,0x808080808080808);
    sVar28 = auVar30._0_2_;
    auVar44._0_2_ = auVar43._0_2_ + sVar28;
    sVar31 = auVar30._2_2_;
    auVar44._2_2_ = auVar43._2_2_ + sVar31;
    sVar32 = auVar30._4_2_;
    auVar44._4_2_ = auVar43._4_2_ + sVar32;
    sVar33 = auVar30._6_2_;
    auVar44._6_2_ = auVar43._6_2_ + sVar33;
    sVar34 = auVar30._8_2_;
    auVar44._8_2_ = auVar43._8_2_ + sVar34;
    sVar35 = auVar30._10_2_;
    auVar44._10_2_ = auVar43._10_2_ + sVar35;
    sVar36 = auVar30._12_2_;
    auVar44._12_2_ = auVar43._12_2_ + sVar36;
    sVar37 = auVar30._14_2_;
    auVar44._14_2_ = auVar43._14_2_ + sVar37;
    auVar30 = psraw(auVar44,4);
    sVar6 = auVar30._0_2_;
    sVar7 = auVar30._2_2_;
    sVar8 = auVar30._4_2_;
    sVar9 = auVar30._6_2_;
    *(uint *)dst = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9),
                            CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8),
                                     CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar30[2] -
                                              (0xff < sVar7),
                                              (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] -
                                              (0xff < sVar6))));
    auVar30 = phaddw(auVar49,auVar49);
    auVar50._0_2_ = auVar30._0_2_ + sVar28;
    auVar50._2_2_ = auVar30._2_2_ + sVar31;
    auVar50._4_2_ = auVar30._4_2_ + sVar32;
    auVar50._6_2_ = auVar30._6_2_ + sVar33;
    auVar50._8_2_ = auVar30._8_2_ + sVar34;
    auVar50._10_2_ = auVar30._10_2_ + sVar35;
    auVar50._12_2_ = auVar30._12_2_ + sVar36;
    auVar50._14_2_ = auVar30._14_2_ + sVar37;
    auVar30 = psraw(auVar50,4);
    sVar6 = auVar30._0_2_;
    sVar7 = auVar30._2_2_;
    sVar8 = auVar30._4_2_;
    sVar9 = auVar30._6_2_;
    auVar51._0_4_ =
         CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9),
                  CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8),
                           CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar30[2] - (0xff < sVar7),
                                    (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6))));
    sVar10 = auVar30._8_2_;
    auVar51[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar30[8] - (0xff < sVar10);
    sVar11 = auVar30._10_2_;
    auVar51[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar30[10] - (0xff < sVar11);
    sVar12 = auVar30._12_2_;
    auVar51[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar30[0xc] - (0xff < sVar12);
    sVar13 = auVar30._14_2_;
    auVar51[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar30[0xe] - (0xff < sVar13);
    auVar51[8] = (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6);
    auVar51[9] = (0 < sVar7) * (sVar7 < 0x100) * auVar30[2] - (0xff < sVar7);
    auVar51[10] = (0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8);
    auVar51[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9);
    auVar51[0xc] = (0 < sVar10) * (sVar10 < 0x100) * auVar30[8] - (0xff < sVar10);
    auVar51[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar30[10] - (0xff < sVar11);
    auVar51[0xe] = (0 < sVar12) * (sVar12 < 0x100) * auVar30[0xc] - (0xff < sVar12);
    auVar51[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar30[0xe] - (0xff < sVar13);
    *(undefined4 *)(dst + stride) = auVar51._0_4_;
    auVar43 = pshufb(auVar51,_DAT_0056aaa0);
    auVar30 = pshufb(ZEXT416(uVar3) << 0x40,_DAT_0056ab00);
    auVar30 = auVar30 | auVar43;
    auVar43 = pmaddubsw(auVar30,auVar27);
    auVar49 = pmaddubsw(auVar30,auVar42);
    auVar43 = phaddw(auVar43,auVar49);
    auVar43 = phaddw(auVar43,auVar43);
    auVar45._0_2_ = auVar43._0_2_ + sVar28;
    auVar45._2_2_ = auVar43._2_2_ + sVar31;
    auVar45._4_2_ = auVar43._4_2_ + sVar32;
    auVar45._6_2_ = auVar43._6_2_ + sVar33;
    auVar45._8_2_ = auVar43._8_2_ + sVar34;
    auVar45._10_2_ = auVar43._10_2_ + sVar35;
    auVar45._12_2_ = auVar43._12_2_ + sVar36;
    auVar45._14_2_ = auVar43._14_2_ + sVar37;
    auVar43 = pmaddubsw(auVar30,auVar1);
    auVar30 = pmaddubsw(auVar30,auVar2);
    auVar43 = phaddw(auVar43,auVar30);
    auVar30 = psraw(auVar45,4);
    auVar43 = phaddw(auVar43,auVar43);
    sVar6 = auVar30._0_2_;
    sVar7 = auVar30._2_2_;
    sVar8 = auVar30._4_2_;
    sVar9 = auVar30._6_2_;
    *(uint *)(dst + stride * 2) =
         CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9),
                  CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8),
                           CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar30[2] - (0xff < sVar7),
                                    (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6))));
    auVar52._0_2_ = auVar43._0_2_ + sVar28;
    auVar52._2_2_ = auVar43._2_2_ + sVar31;
    auVar52._4_2_ = auVar43._4_2_ + sVar32;
    auVar52._6_2_ = auVar43._6_2_ + sVar33;
    auVar52._8_2_ = auVar43._8_2_ + sVar34;
    auVar52._10_2_ = auVar43._10_2_ + sVar35;
    auVar52._12_2_ = auVar43._12_2_ + sVar36;
    auVar52._14_2_ = auVar43._14_2_ + sVar37;
    auVar30 = psraw(auVar52,4);
    sVar6 = auVar30._0_2_;
    sVar7 = auVar30._2_2_;
    sVar8 = auVar30._4_2_;
    sVar9 = auVar30._6_2_;
    *(uint *)(dst + stride * 3) =
         CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9),
                  CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8),
                           CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar30[2] - (0xff < sVar7),
                                    (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6))));
    if ((0x7dfdeUL >> ((ulong)tx_size & 0x3f) & 1) != 0) {
      lVar16 = 3;
      do {
        lVar18 = lVar16;
        uVar15 = CONCAT16(dst[lVar18 + stride],
                          CONCAT15(dst[lVar18],
                                   CONCAT14(above[lVar18 + 4],*(undefined4 *)(above + lVar18))));
        auVar38[7] = 0;
        auVar38._0_7_ = uVar15;
        auVar38._8_4_ = *(undefined4 *)(above + lVar18);
        auVar38._12_3_ = (int3)(uVar15 >> 0x20);
        auVar38[0xf] = 0;
        auVar30 = pmaddubsw(auVar38,auVar27);
        auVar43 = pmaddubsw(auVar38,auVar42);
        auVar30 = phaddw(auVar30,auVar43);
        auVar30 = phaddw(auVar30,auVar30);
        auVar46._0_2_ = auVar30._0_2_ + sVar28;
        auVar46._2_2_ = auVar30._2_2_ + sVar31;
        auVar46._4_2_ = auVar30._4_2_ + sVar32;
        auVar46._6_2_ = auVar30._6_2_ + sVar33;
        auVar46._8_2_ = auVar30._8_2_ + sVar34;
        auVar46._10_2_ = auVar30._10_2_ + sVar35;
        auVar46._12_2_ = auVar30._12_2_ + sVar36;
        auVar46._14_2_ = auVar30._14_2_ + sVar37;
        auVar43 = psraw(auVar46,4);
        auVar49 = pmaddubsw(auVar38,auVar1);
        auVar30 = pmaddubsw(auVar38,auVar2);
        auVar30 = phaddw(auVar49,auVar30);
        sVar6 = auVar43._0_2_;
        sVar7 = auVar43._2_2_;
        sVar8 = auVar43._4_2_;
        sVar9 = auVar43._6_2_;
        auVar30 = phaddw(auVar30,auVar30);
        *(uint *)(dst + lVar18 + 1) =
             CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar43[6] - (0xff < sVar9),
                      CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar43[4] - (0xff < sVar8),
                               CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar43[2] - (0xff < sVar7),
                                        (0 < sVar6) * (sVar6 < 0x100) * auVar43[0] - (0xff < sVar6))
                              ));
        auVar53._0_2_ = auVar30._0_2_ + sVar28;
        auVar53._2_2_ = auVar30._2_2_ + sVar31;
        auVar53._4_2_ = auVar30._4_2_ + sVar32;
        auVar53._6_2_ = auVar30._6_2_ + sVar33;
        auVar53._8_2_ = auVar30._8_2_ + sVar34;
        auVar53._10_2_ = auVar30._10_2_ + sVar35;
        auVar53._12_2_ = auVar30._12_2_ + sVar36;
        auVar53._14_2_ = auVar30._14_2_ + sVar37;
        auVar30 = psraw(auVar53,4);
        sVar6 = auVar30._0_2_;
        sVar7 = auVar30._2_2_;
        sVar8 = auVar30._4_2_;
        sVar9 = auVar30._6_2_;
        *(uint *)(dst + lVar18 + stride + 1) =
             CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9),
                      CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8),
                               CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar30[2] - (0xff < sVar7),
                                        (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6))
                              ));
        uVar15 = CONCAT16(dst[lVar18 + stride * 3],
                          CONCAT15(dst[lVar18 + stride * 2],
                                   CONCAT14(dst[lVar18 + stride + 4],
                                            *(undefined4 *)(dst + lVar18 + stride))));
        auVar39[7] = 0;
        auVar39._0_7_ = uVar15;
        auVar39._8_4_ = *(undefined4 *)(dst + lVar18 + stride);
        auVar39._12_3_ = (int3)(uVar15 >> 0x20);
        auVar39[0xf] = 0;
        auVar30 = pmaddubsw(auVar39,auVar27);
        auVar43 = pmaddubsw(auVar39,auVar42);
        auVar30 = phaddw(auVar30,auVar43);
        auVar30 = phaddw(auVar30,auVar30);
        auVar47._0_2_ = auVar30._0_2_ + sVar28;
        auVar47._2_2_ = auVar30._2_2_ + sVar31;
        auVar47._4_2_ = auVar30._4_2_ + sVar32;
        auVar47._6_2_ = auVar30._6_2_ + sVar33;
        auVar47._8_2_ = auVar30._8_2_ + sVar34;
        auVar47._10_2_ = auVar30._10_2_ + sVar35;
        auVar47._12_2_ = auVar30._12_2_ + sVar36;
        auVar47._14_2_ = auVar30._14_2_ + sVar37;
        auVar43 = pmaddubsw(auVar39,auVar1);
        auVar30 = pmaddubsw(auVar39,auVar2);
        auVar43 = phaddw(auVar43,auVar30);
        auVar30 = psraw(auVar47,4);
        auVar43 = phaddw(auVar43,auVar43);
        sVar6 = auVar30._0_2_;
        sVar7 = auVar30._2_2_;
        sVar8 = auVar30._4_2_;
        sVar9 = auVar30._6_2_;
        *(uint *)(dst + lVar18 + stride * 2 + 1) =
             CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9),
                      CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8),
                               CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar30[2] - (0xff < sVar7),
                                        (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6))
                              ));
        auVar54._0_2_ = auVar43._0_2_ + sVar28;
        auVar54._2_2_ = auVar43._2_2_ + sVar31;
        auVar54._4_2_ = auVar43._4_2_ + sVar32;
        auVar54._6_2_ = auVar43._6_2_ + sVar33;
        auVar54._8_2_ = auVar43._8_2_ + sVar34;
        auVar54._10_2_ = auVar43._10_2_ + sVar35;
        auVar54._12_2_ = auVar43._12_2_ + sVar36;
        auVar54._14_2_ = auVar43._14_2_ + sVar37;
        auVar30 = psraw(auVar54,4);
        sVar6 = auVar30._0_2_;
        sVar7 = auVar30._2_2_;
        sVar8 = auVar30._4_2_;
        sVar9 = auVar30._6_2_;
        *(uint *)(dst + lVar18 + stride * 3 + 1) =
             CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9),
                      CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8),
                               CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar30[2] - (0xff < sVar7),
                                        (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6))
                              ));
        lVar16 = lVar18 + 4;
      } while (lVar18 + 4 < lVar23 + -4);
      dst = dst + lVar18 + 1;
    }
    auVar49 = _DAT_0056ab20;
    auVar43 = _DAT_0056ab10;
    auVar30 = _DAT_0056aaa0;
    if ((0x7bfbeUL >> ((ulong)tx_size & 0x3f) & 1) != 0) {
      lVar18 = stride * 4 - lVar23;
      lVar19 = stride * 7 - lVar23;
      lVar20 = stride * 6 - lVar23;
      lVar21 = stride * 5 - lVar23;
      lVar16 = stride * 3 - lVar23;
      uVar26 = 4;
      do {
        puVar17 = dst + (stride * 4 - lVar23) + 4;
        auVar82 = pshufb(ZEXT416(*(uint *)(left + (uVar26 - 1))) << 0x40 |
                         ZEXT416(*(uint *)(puVar17 + -stride)),auVar43);
        auVar70 = pmaddubsw(auVar82,auVar27);
        auVar87 = pmaddubsw(auVar82,auVar42);
        auVar70 = phaddw(auVar70,auVar87);
        auVar87 = phaddw(auVar70,auVar70);
        auVar70 = pshufb(ZEXT516(CONCAT14(left[uVar26 + 3],*(uint *)(left + (uVar26 - 1)))) << 0x40,
                         auVar49);
        auVar71._0_2_ = auVar87._0_2_ + sVar28;
        auVar71._2_2_ = auVar87._2_2_ + sVar31;
        auVar71._4_2_ = auVar87._4_2_ + sVar32;
        auVar71._6_2_ = auVar87._6_2_ + sVar33;
        auVar71._8_2_ = auVar87._8_2_ + sVar34;
        auVar71._10_2_ = auVar87._10_2_ + sVar35;
        auVar71._12_2_ = auVar87._12_2_ + sVar36;
        auVar71._14_2_ = auVar87._14_2_ + sVar37;
        auVar87 = psraw(auVar71,4);
        sVar6 = auVar87._0_2_;
        sVar7 = auVar87._2_2_;
        sVar8 = auVar87._4_2_;
        sVar9 = auVar87._6_2_;
        *(uint *)(dst + stride * 4 + (4 - lVar23)) =
             CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar87[6] - (0xff < sVar9),
                      CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar87[4] - (0xff < sVar8),
                               CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar87[2] - (0xff < sVar7),
                                        (0 < sVar6) * (sVar6 < 0x100) * auVar87[0] - (0xff < sVar6))
                              ));
        auVar87 = pmaddubsw(auVar82,auVar1);
        auVar82 = pmaddubsw(auVar82,auVar2);
        auVar87 = phaddw(auVar87,auVar82);
        auVar87 = phaddw(auVar87,auVar87);
        auVar72._0_2_ = auVar87._0_2_ + sVar28;
        auVar72._2_2_ = auVar87._2_2_ + sVar31;
        auVar72._4_2_ = auVar87._4_2_ + sVar32;
        auVar72._6_2_ = auVar87._6_2_ + sVar33;
        auVar72._8_2_ = auVar87._8_2_ + sVar34;
        auVar72._10_2_ = auVar87._10_2_ + sVar35;
        auVar72._12_2_ = auVar87._12_2_ + sVar36;
        auVar72._14_2_ = auVar87._14_2_ + sVar37;
        auVar87 = psraw(auVar72,4);
        sVar6 = auVar87._0_2_;
        sVar7 = auVar87._2_2_;
        sVar8 = auVar87._4_2_;
        sVar9 = auVar87._6_2_;
        auVar73._0_4_ =
             CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar87[6] - (0xff < sVar9),
                      CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar87[4] - (0xff < sVar8),
                               CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar87[2] - (0xff < sVar7),
                                        (0 < sVar6) * (sVar6 < 0x100) * auVar87[0] - (0xff < sVar6))
                              ));
        sVar10 = auVar87._8_2_;
        auVar73[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar87[8] - (0xff < sVar10);
        sVar11 = auVar87._10_2_;
        auVar73[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar87[10] - (0xff < sVar11);
        sVar12 = auVar87._12_2_;
        auVar73[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar87[0xc] - (0xff < sVar12);
        sVar13 = auVar87._14_2_;
        auVar73[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar87[0xe] - (0xff < sVar13);
        auVar73[8] = (0 < sVar6) * (sVar6 < 0x100) * auVar87[0] - (0xff < sVar6);
        auVar73[9] = (0 < sVar7) * (sVar7 < 0x100) * auVar87[2] - (0xff < sVar7);
        auVar73[10] = (0 < sVar8) * (sVar8 < 0x100) * auVar87[4] - (0xff < sVar8);
        auVar73[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar87[6] - (0xff < sVar9);
        auVar73[0xc] = (0 < sVar10) * (sVar10 < 0x100) * auVar87[8] - (0xff < sVar10);
        auVar73[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar87[10] - (0xff < sVar11);
        auVar73[0xe] = (0 < sVar12) * (sVar12 < 0x100) * auVar87[0xc] - (0xff < sVar12);
        auVar73[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar87[0xe] - (0xff < sVar13);
        *(undefined4 *)(puVar17 + stride) = auVar73._0_4_;
        auVar87 = pshufb(auVar73,auVar30);
        auVar87 = auVar87 | auVar70;
        auVar70 = pmaddubsw(auVar87,auVar27);
        auVar82 = pmaddubsw(auVar87,auVar42);
        auVar70 = phaddw(auVar70,auVar82);
        auVar70 = phaddw(auVar70,auVar70);
        auVar61._0_2_ = auVar70._0_2_ + sVar28;
        auVar61._2_2_ = auVar70._2_2_ + sVar31;
        auVar61._4_2_ = auVar70._4_2_ + sVar32;
        auVar61._6_2_ = auVar70._6_2_ + sVar33;
        auVar61._8_2_ = auVar70._8_2_ + sVar34;
        auVar61._10_2_ = auVar70._10_2_ + sVar35;
        auVar61._12_2_ = auVar70._12_2_ + sVar36;
        auVar61._14_2_ = auVar70._14_2_ + sVar37;
        auVar70 = psraw(auVar61,4);
        sVar6 = auVar70._0_2_;
        sVar7 = auVar70._2_2_;
        sVar8 = auVar70._4_2_;
        sVar9 = auVar70._6_2_;
        *(uint *)(puVar17 + stride * 2) =
             CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar70[6] - (0xff < sVar9),
                      CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar70[4] - (0xff < sVar8),
                               CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar70[2] - (0xff < sVar7),
                                        (0 < sVar6) * (sVar6 < 0x100) * auVar70[0] - (0xff < sVar6))
                              ));
        auVar70 = pmaddubsw(auVar87,auVar1);
        auVar87 = pmaddubsw(auVar87,auVar2);
        auVar70 = phaddw(auVar70,auVar87);
        auVar70 = phaddw(auVar70,auVar70);
        auVar62._0_2_ = auVar70._0_2_ + sVar28;
        auVar62._2_2_ = auVar70._2_2_ + sVar31;
        auVar62._4_2_ = auVar70._4_2_ + sVar32;
        auVar62._6_2_ = auVar70._6_2_ + sVar33;
        auVar62._8_2_ = auVar70._8_2_ + sVar34;
        auVar62._10_2_ = auVar70._10_2_ + sVar35;
        auVar62._12_2_ = auVar70._12_2_ + sVar36;
        auVar62._14_2_ = auVar70._14_2_ + sVar37;
        auVar70 = psraw(auVar62,4);
        sVar6 = auVar70._0_2_;
        sVar7 = auVar70._2_2_;
        sVar8 = auVar70._4_2_;
        sVar9 = auVar70._6_2_;
        *(uint *)(puVar17 + stride * 3) =
             CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar70[6] - (0xff < sVar9),
                      CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar70[4] - (0xff < sVar8),
                               CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar70[2] - (0xff < sVar7),
                                        (0 < sVar6) * (sVar6 < 0x100) * auVar70[0] - (0xff < sVar6))
                              ));
        if ((0x7dfdeUL >> (tx_size & 0x3f) & 1) != 0) {
          lVar24 = 0;
          do {
            uVar15 = CONCAT16(dst[lVar24 + lVar21 + 7],
                              CONCAT15(dst[lVar24 + lVar18 + 7],
                                       CONCAT14(dst[lVar24 + lVar16 + 0xb],
                                                *(undefined4 *)(dst + lVar24 + lVar16 + 7))));
            auVar63[7] = 0;
            auVar63._0_7_ = uVar15;
            auVar63._8_4_ = *(undefined4 *)(dst + lVar24 + lVar16 + 7);
            auVar63._12_3_ = (int3)(uVar15 >> 0x20);
            auVar63[0xf] = 0;
            auVar70 = pmaddubsw(auVar63,auVar27);
            auVar87 = pmaddubsw(auVar63,auVar42);
            auVar70 = phaddw(auVar70,auVar87);
            auVar70 = phaddw(auVar70,auVar70);
            auVar74._0_2_ = auVar70._0_2_ + sVar28;
            auVar74._2_2_ = auVar70._2_2_ + sVar31;
            auVar74._4_2_ = auVar70._4_2_ + sVar32;
            auVar74._6_2_ = auVar70._6_2_ + sVar33;
            auVar74._8_2_ = auVar70._8_2_ + sVar34;
            auVar74._10_2_ = auVar70._10_2_ + sVar35;
            auVar74._12_2_ = auVar70._12_2_ + sVar36;
            auVar74._14_2_ = auVar70._14_2_ + sVar37;
            auVar87 = psraw(auVar74,4);
            auVar82 = pmaddubsw(auVar63,auVar1);
            auVar70 = pmaddubsw(auVar63,auVar2);
            auVar70 = phaddw(auVar82,auVar70);
            sVar6 = auVar87._0_2_;
            sVar7 = auVar87._2_2_;
            sVar8 = auVar87._4_2_;
            sVar9 = auVar87._6_2_;
            auVar70 = phaddw(auVar70,auVar70);
            *(uint *)(dst + lVar24 + lVar18 + 8) =
                 CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar87[6] - (0xff < sVar9),
                          CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar87[4] - (0xff < sVar8),
                                   CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar87[2] -
                                            (0xff < sVar7),
                                            (0 < sVar6) * (sVar6 < 0x100) * auVar87[0] -
                                            (0xff < sVar6))));
            auVar83._0_2_ = auVar70._0_2_ + sVar28;
            auVar83._2_2_ = auVar70._2_2_ + sVar31;
            auVar83._4_2_ = auVar70._4_2_ + sVar32;
            auVar83._6_2_ = auVar70._6_2_ + sVar33;
            auVar83._8_2_ = auVar70._8_2_ + sVar34;
            auVar83._10_2_ = auVar70._10_2_ + sVar35;
            auVar83._12_2_ = auVar70._12_2_ + sVar36;
            auVar83._14_2_ = auVar70._14_2_ + sVar37;
            auVar70 = psraw(auVar83,4);
            sVar6 = auVar70._0_2_;
            sVar7 = auVar70._2_2_;
            sVar8 = auVar70._4_2_;
            sVar9 = auVar70._6_2_;
            *(uint *)(dst + lVar24 + lVar21 + 8) =
                 CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar70[6] - (0xff < sVar9),
                          CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar70[4] - (0xff < sVar8),
                                   CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar70[2] -
                                            (0xff < sVar7),
                                            (0 < sVar6) * (sVar6 < 0x100) * auVar70[0] -
                                            (0xff < sVar6))));
            uVar15 = CONCAT16(dst[lVar24 + lVar19 + 7],
                              CONCAT15(dst[lVar24 + lVar20 + 7],
                                       CONCAT14(dst[lVar24 + lVar21 + 0xb],
                                                *(undefined4 *)(dst + lVar24 + lVar21 + 7))));
            auVar64[7] = 0;
            auVar64._0_7_ = uVar15;
            auVar64._8_4_ = *(undefined4 *)(dst + lVar24 + lVar21 + 7);
            auVar64._12_3_ = (int3)(uVar15 >> 0x20);
            auVar64[0xf] = 0;
            auVar70 = pmaddubsw(auVar64,auVar27);
            auVar87 = pmaddubsw(auVar64,auVar42);
            auVar70 = phaddw(auVar70,auVar87);
            auVar70 = phaddw(auVar70,auVar70);
            auVar75._0_2_ = auVar70._0_2_ + sVar28;
            auVar75._2_2_ = auVar70._2_2_ + sVar31;
            auVar75._4_2_ = auVar70._4_2_ + sVar32;
            auVar75._6_2_ = auVar70._6_2_ + sVar33;
            auVar75._8_2_ = auVar70._8_2_ + sVar34;
            auVar75._10_2_ = auVar70._10_2_ + sVar35;
            auVar75._12_2_ = auVar70._12_2_ + sVar36;
            auVar75._14_2_ = auVar70._14_2_ + sVar37;
            auVar87 = psraw(auVar75,4);
            auVar82 = pmaddubsw(auVar64,auVar1);
            auVar70 = pmaddubsw(auVar64,auVar2);
            auVar70 = phaddw(auVar82,auVar70);
            sVar6 = auVar87._0_2_;
            sVar7 = auVar87._2_2_;
            sVar8 = auVar87._4_2_;
            sVar9 = auVar87._6_2_;
            auVar70 = phaddw(auVar70,auVar70);
            *(uint *)(dst + lVar24 + lVar20 + 8) =
                 CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar87[6] - (0xff < sVar9),
                          CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar87[4] - (0xff < sVar8),
                                   CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar87[2] -
                                            (0xff < sVar7),
                                            (0 < sVar6) * (sVar6 < 0x100) * auVar87[0] -
                                            (0xff < sVar6))));
            auVar84._0_2_ = auVar70._0_2_ + sVar28;
            auVar84._2_2_ = auVar70._2_2_ + sVar31;
            auVar84._4_2_ = auVar70._4_2_ + sVar32;
            auVar84._6_2_ = auVar70._6_2_ + sVar33;
            auVar84._8_2_ = auVar70._8_2_ + sVar34;
            auVar84._10_2_ = auVar70._10_2_ + sVar35;
            auVar84._12_2_ = auVar70._12_2_ + sVar36;
            auVar84._14_2_ = auVar70._14_2_ + sVar37;
            auVar70 = psraw(auVar84,4);
            sVar6 = auVar70._0_2_;
            sVar7 = auVar70._2_2_;
            sVar8 = auVar70._4_2_;
            sVar9 = auVar70._6_2_;
            *(uint *)(dst + lVar24 + lVar19 + 8) =
                 CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar70[6] - (0xff < sVar9),
                          CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar70[4] - (0xff < sVar8),
                                   CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar70[2] -
                                            (0xff < sVar7),
                                            (0 < sVar6) * (sVar6 < 0x100) * auVar70[0] -
                                            (0xff < sVar6))));
            lVar25 = lVar24 + 4;
            iVar14 = (int)lVar24;
            lVar24 = lVar25;
          } while (iVar14 + 8 < iVar4);
          puVar17 = dst + lVar25 + lVar18 + 4;
        }
        uVar26 = uVar26 + 4;
        dst = puVar17;
      } while (uVar26 < uVar5);
    }
  }
  else {
    if ((0x4041UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)left;
    }
    else {
      auVar30 = ZEXT416(*(uint *)left);
    }
    uVar26 = auVar30._0_8_;
    auVar43._0_8_ = uVar26 << 0x28;
    auVar43._8_8_ = auVar30._8_8_ << 0x28 | uVar26 >> 0x18;
    auVar30 = ZEXT516(*(uint5 *)(above + -1)) | auVar43;
    auVar49._0_8_ = auVar30._0_8_;
    auVar49._8_4_ = auVar30._0_4_;
    auVar49._12_4_ = auVar30._4_4_;
    auVar70 = pmaddubsw(auVar49,auVar27);
    auVar30 = pmaddubsw(auVar49,auVar42);
    auVar70 = phaddw(auVar70,auVar30);
    auVar70 = phaddw(auVar70,auVar70);
    auVar30 = pmovsxbw(auVar30,0x808080808080808);
    sVar28 = auVar30._0_2_;
    auVar87._0_2_ = auVar70._0_2_ + sVar28;
    sVar31 = auVar30._2_2_;
    auVar87._2_2_ = auVar70._2_2_ + sVar31;
    sVar32 = auVar30._4_2_;
    auVar87._4_2_ = auVar70._4_2_ + sVar32;
    sVar33 = auVar30._6_2_;
    auVar87._6_2_ = auVar70._6_2_ + sVar33;
    sVar34 = auVar30._8_2_;
    auVar87._8_2_ = auVar70._8_2_ + sVar34;
    sVar35 = auVar30._10_2_;
    auVar87._10_2_ = auVar70._10_2_ + sVar35;
    sVar36 = auVar30._12_2_;
    auVar87._12_2_ = auVar70._12_2_ + sVar36;
    sVar37 = auVar30._14_2_;
    auVar87._14_2_ = auVar70._14_2_ + sVar37;
    auVar70 = pmaddubsw(auVar49,auVar1);
    auVar30 = pmaddubsw(auVar49,auVar2);
    auVar49 = phaddw(auVar70,auVar30);
    auVar30 = psraw(auVar87,4);
    auVar49 = phaddw(auVar49,auVar49);
    sVar6 = auVar30._0_2_;
    sVar7 = auVar30._2_2_;
    sVar8 = auVar30._4_2_;
    sVar9 = auVar30._6_2_;
    *(uint *)dst = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9),
                            CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8),
                                     CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar30[2] -
                                              (0xff < sVar7),
                                              (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] -
                                              (0xff < sVar6))));
    auVar65._0_2_ = auVar49._0_2_ + sVar28;
    auVar65._2_2_ = auVar49._2_2_ + sVar31;
    auVar65._4_2_ = auVar49._4_2_ + sVar32;
    auVar65._6_2_ = auVar49._6_2_ + sVar33;
    auVar65._8_2_ = auVar49._8_2_ + sVar34;
    auVar65._10_2_ = auVar49._10_2_ + sVar35;
    auVar65._12_2_ = auVar49._12_2_ + sVar36;
    auVar65._14_2_ = auVar49._14_2_ + sVar37;
    auVar30 = psraw(auVar65,4);
    sVar6 = auVar30._0_2_;
    sVar7 = auVar30._2_2_;
    sVar8 = auVar30._4_2_;
    sVar9 = auVar30._6_2_;
    auVar66._0_4_ =
         CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9),
                  CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8),
                           CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar30[2] - (0xff < sVar7),
                                    (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6))));
    sVar10 = auVar30._8_2_;
    auVar66[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar30[8] - (0xff < sVar10);
    sVar11 = auVar30._10_2_;
    auVar66[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar30[10] - (0xff < sVar11);
    sVar12 = auVar30._12_2_;
    auVar66[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar30[0xc] - (0xff < sVar12);
    sVar13 = auVar30._14_2_;
    auVar66[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar30[0xe] - (0xff < sVar13);
    auVar66[8] = (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6);
    auVar66[9] = (0 < sVar7) * (sVar7 < 0x100) * auVar30[2] - (0xff < sVar7);
    auVar66[10] = (0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8);
    auVar66[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9);
    auVar66[0xc] = (0 < sVar10) * (sVar10 < 0x100) * auVar30[8] - (0xff < sVar10);
    auVar66[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar30[10] - (0xff < sVar11);
    auVar66[0xe] = (0 < sVar12) * (sVar12 < 0x100) * auVar30[0xc] - (0xff < sVar12);
    auVar66[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar30[0xe] - (0xff < sVar13);
    *(undefined4 *)(dst + stride) = auVar66._0_4_;
    auVar49 = pshufb(auVar66,_DAT_0056aaa0);
    auVar30 = pshufb(auVar43,_DAT_0056aab0);
    auVar30 = auVar30 | auVar49;
    auVar70 = pmaddubsw(auVar30,auVar27);
    auVar49 = pmaddubsw(auVar30,auVar42);
    auVar49 = phaddw(auVar70,auVar49);
    auVar49 = phaddw(auVar49,auVar49);
    auVar67._0_2_ = auVar49._0_2_ + sVar28;
    auVar67._2_2_ = auVar49._2_2_ + sVar31;
    auVar67._4_2_ = auVar49._4_2_ + sVar32;
    auVar67._6_2_ = auVar49._6_2_ + sVar33;
    auVar67._8_2_ = auVar49._8_2_ + sVar34;
    auVar67._10_2_ = auVar49._10_2_ + sVar35;
    auVar67._12_2_ = auVar49._12_2_ + sVar36;
    auVar67._14_2_ = auVar49._14_2_ + sVar37;
    auVar70 = psraw(auVar67,4);
    sVar6 = auVar70._0_2_;
    sVar7 = auVar70._2_2_;
    sVar8 = auVar70._4_2_;
    sVar9 = auVar70._6_2_;
    auVar49 = pmaddubsw(auVar30,auVar1);
    auVar30 = pmaddubsw(auVar30,auVar2);
    auVar30 = phaddw(auVar49,auVar30);
    *(uint *)(dst + stride * 2) =
         CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar70[6] - (0xff < sVar9),
                  CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar70[4] - (0xff < sVar8),
                           CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar70[2] - (0xff < sVar7),
                                    (0 < sVar6) * (sVar6 < 0x100) * auVar70[0] - (0xff < sVar6))));
    auVar30 = phaddw(auVar30,auVar30);
    auVar70._0_2_ = auVar30._0_2_ + sVar28;
    auVar70._2_2_ = auVar30._2_2_ + sVar31;
    auVar70._4_2_ = auVar30._4_2_ + sVar32;
    auVar70._6_2_ = auVar30._6_2_ + sVar33;
    auVar70._8_2_ = auVar30._8_2_ + sVar34;
    auVar70._10_2_ = auVar30._10_2_ + sVar35;
    auVar70._12_2_ = auVar30._12_2_ + sVar36;
    auVar70._14_2_ = auVar30._14_2_ + sVar37;
    auVar30 = psraw(auVar70,4);
    sVar6 = auVar30._0_2_;
    sVar7 = auVar30._2_2_;
    sVar8 = auVar30._4_2_;
    sVar9 = auVar30._6_2_;
    auVar82._0_4_ =
         CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9),
                  CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8),
                           CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar30[2] - (0xff < sVar7),
                                    (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6))));
    sVar10 = auVar30._8_2_;
    auVar82[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar30[8] - (0xff < sVar10);
    sVar11 = auVar30._10_2_;
    auVar82[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar30[10] - (0xff < sVar11);
    sVar12 = auVar30._12_2_;
    auVar82[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar30[0xc] - (0xff < sVar12);
    sVar13 = auVar30._14_2_;
    auVar82[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar30[0xe] - (0xff < sVar13);
    auVar82[8] = (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6);
    auVar82[9] = (0 < sVar7) * (sVar7 < 0x100) * auVar30[2] - (0xff < sVar7);
    auVar82[10] = (0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8);
    auVar82[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9);
    auVar82[0xc] = (0 < sVar10) * (sVar10 < 0x100) * auVar30[8] - (0xff < sVar10);
    auVar82[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar30[10] - (0xff < sVar11);
    auVar82[0xe] = (0 < sVar12) * (sVar12 < 0x100) * auVar30[0xc] - (0xff < sVar12);
    auVar82[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar30[0xe] - (0xff < sVar13);
    *(undefined4 *)(dst + stride * 3) = auVar82._0_4_;
    auVar30 = _DAT_0056aaa0;
    puVar22 = (uint *)(dst + stride * 3);
    if ((0x42484UL >> ((ulong)tx_size & 0x3f) & 1) != 0) {
      auVar40._0_8_ = uVar26 << 0x30;
      auVar43._8_8_ = auVar43._8_8_ << 8;
      auVar40._8_8_ = auVar43._8_8_ | auVar43._0_8_ >> 0x38;
      auVar49 = pshufb(auVar82,_DAT_0056aaa0);
      auVar70 = pshufb(auVar40,_DAT_0056aac0);
      auVar70 = auVar70 | auVar49;
      auVar49 = pmaddubsw(auVar70,auVar27);
      auVar87 = pmaddubsw(auVar70,auVar42);
      auVar49 = phaddw(auVar49,auVar87);
      auVar49 = phaddw(auVar49,auVar49);
      auVar55._0_2_ = auVar49._0_2_ + sVar28;
      auVar55._2_2_ = auVar49._2_2_ + sVar31;
      auVar55._4_2_ = auVar49._4_2_ + sVar32;
      auVar55._6_2_ = auVar49._6_2_ + sVar33;
      auVar55._8_2_ = auVar49._8_2_ + sVar34;
      auVar55._10_2_ = auVar49._10_2_ + sVar35;
      auVar55._12_2_ = auVar49._12_2_ + sVar36;
      auVar55._14_2_ = auVar49._14_2_ + sVar37;
      auVar49 = psraw(auVar55,4);
      sVar6 = auVar49._0_2_;
      sVar7 = auVar49._2_2_;
      sVar8 = auVar49._4_2_;
      sVar9 = auVar49._6_2_;
      auVar87 = pmaddubsw(auVar70,auVar1);
      auVar70 = pmaddubsw(auVar70,auVar2);
      auVar70 = phaddw(auVar87,auVar70);
      *(uint *)((long)puVar22 + stride) =
           CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar49[6] - (0xff < sVar9),
                    CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar49[4] - (0xff < sVar8),
                             CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar49[2] - (0xff < sVar7),
                                      (0 < sVar6) * (sVar6 < 0x100) * auVar49[0] - (0xff < sVar6))))
      ;
      auVar49 = phaddw(auVar70,auVar70);
      auVar76._0_2_ = auVar49._0_2_ + sVar28;
      auVar76._2_2_ = auVar49._2_2_ + sVar31;
      auVar76._4_2_ = auVar49._4_2_ + sVar32;
      auVar76._6_2_ = auVar49._6_2_ + sVar33;
      auVar76._8_2_ = auVar49._8_2_ + sVar34;
      auVar76._10_2_ = auVar49._10_2_ + sVar35;
      auVar76._12_2_ = auVar49._12_2_ + sVar36;
      auVar76._14_2_ = auVar49._14_2_ + sVar37;
      auVar49 = psraw(auVar76,4);
      sVar6 = auVar49._0_2_;
      sVar7 = auVar49._2_2_;
      sVar8 = auVar49._4_2_;
      sVar9 = auVar49._6_2_;
      auVar77._0_4_ =
           CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar49[6] - (0xff < sVar9),
                    CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar49[4] - (0xff < sVar8),
                             CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar49[2] - (0xff < sVar7),
                                      (0 < sVar6) * (sVar6 < 0x100) * auVar49[0] - (0xff < sVar6))))
      ;
      sVar10 = auVar49._8_2_;
      auVar77[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar49[8] - (0xff < sVar10);
      sVar11 = auVar49._10_2_;
      auVar77[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar49[10] - (0xff < sVar11);
      sVar12 = auVar49._12_2_;
      auVar77[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar49[0xc] - (0xff < sVar12);
      sVar13 = auVar49._14_2_;
      auVar77[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar49[0xe] - (0xff < sVar13);
      auVar77[8] = (0 < sVar6) * (sVar6 < 0x100) * auVar49[0] - (0xff < sVar6);
      auVar77[9] = (0 < sVar7) * (sVar7 < 0x100) * auVar49[2] - (0xff < sVar7);
      auVar77[10] = (0 < sVar8) * (sVar8 < 0x100) * auVar49[4] - (0xff < sVar8);
      auVar77[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar49[6] - (0xff < sVar9);
      auVar77[0xc] = (0 < sVar10) * (sVar10 < 0x100) * auVar49[8] - (0xff < sVar10);
      auVar77[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar49[10] - (0xff < sVar11);
      auVar77[0xe] = (0 < sVar12) * (sVar12 < 0x100) * auVar49[0xc] - (0xff < sVar12);
      auVar77[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar49[0xe] - (0xff < sVar13);
      *(undefined4 *)((long)puVar22 + stride * 2) = auVar77._0_4_;
      uVar26 = *(ulong *)(left + 8);
      auVar70 = pshufb(auVar77,auVar30);
      auVar49 = pshufb(auVar40,_DAT_0056aad0);
      auVar49 = auVar49 | auVar70;
      auVar70 = pmaddubsw(auVar49,auVar27);
      auVar87 = pmaddubsw(auVar49,auVar42);
      auVar70 = phaddw(auVar70,auVar87);
      auVar70 = phaddw(auVar70,auVar70);
      auVar78._0_2_ = auVar70._0_2_ + sVar28;
      auVar78._2_2_ = auVar70._2_2_ + sVar31;
      auVar78._4_2_ = auVar70._4_2_ + sVar32;
      auVar78._6_2_ = auVar70._6_2_ + sVar33;
      auVar78._8_2_ = auVar70._8_2_ + sVar34;
      auVar78._10_2_ = auVar70._10_2_ + sVar35;
      auVar78._12_2_ = auVar70._12_2_ + sVar36;
      auVar78._14_2_ = auVar70._14_2_ + sVar37;
      auVar70 = psraw(auVar78,4);
      sVar6 = auVar70._0_2_;
      sVar7 = auVar70._2_2_;
      sVar8 = auVar70._4_2_;
      sVar9 = auVar70._6_2_;
      auVar87 = pmaddubsw(auVar49,auVar1);
      auVar49 = pmaddubsw(auVar49,auVar2);
      auVar49 = phaddw(auVar87,auVar49);
      *(uint *)((long)puVar22 + stride * 3) =
           CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar70[6] - (0xff < sVar9),
                    CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar70[4] - (0xff < sVar8),
                             CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar70[2] - (0xff < sVar7),
                                      (0 < sVar6) * (sVar6 < 0x100) * auVar70[0] - (0xff < sVar6))))
      ;
      auVar49 = phaddw(auVar49,auVar49);
      auVar85._0_2_ = auVar49._0_2_ + sVar28;
      auVar85._2_2_ = auVar49._2_2_ + sVar31;
      auVar85._4_2_ = auVar49._4_2_ + sVar32;
      auVar85._6_2_ = auVar49._6_2_ + sVar33;
      auVar85._8_2_ = auVar49._8_2_ + sVar34;
      auVar85._10_2_ = auVar49._10_2_ + sVar35;
      auVar85._12_2_ = auVar49._12_2_ + sVar36;
      auVar85._14_2_ = auVar49._14_2_ + sVar37;
      auVar49 = psraw(auVar85,4);
      sVar6 = auVar49._0_2_;
      sVar7 = auVar49._2_2_;
      sVar8 = auVar49._4_2_;
      sVar9 = auVar49._6_2_;
      auVar86._0_4_ =
           CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar49[6] - (0xff < sVar9),
                    CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar49[4] - (0xff < sVar8),
                             CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar49[2] - (0xff < sVar7),
                                      (0 < sVar6) * (sVar6 < 0x100) * auVar49[0] - (0xff < sVar6))))
      ;
      sVar10 = auVar49._8_2_;
      auVar86[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar49[8] - (0xff < sVar10);
      sVar11 = auVar49._10_2_;
      auVar86[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar49[10] - (0xff < sVar11);
      sVar12 = auVar49._12_2_;
      auVar86[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar49[0xc] - (0xff < sVar12);
      sVar13 = auVar49._14_2_;
      auVar86[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar49[0xe] - (0xff < sVar13);
      auVar86[8] = (0 < sVar6) * (sVar6 < 0x100) * auVar49[0] - (0xff < sVar6);
      auVar86[9] = (0 < sVar7) * (sVar7 < 0x100) * auVar49[2] - (0xff < sVar7);
      auVar86[10] = (0 < sVar8) * (sVar8 < 0x100) * auVar49[4] - (0xff < sVar8);
      auVar86[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar49[6] - (0xff < sVar9);
      auVar86[0xc] = (0 < sVar10) * (sVar10 < 0x100) * auVar49[8] - (0xff < sVar10);
      auVar86[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar49[10] - (0xff < sVar11);
      auVar86[0xe] = (0 < sVar12) * (sVar12 < 0x100) * auVar49[0xc] - (0xff < sVar12);
      auVar86[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar49[0xe] - (0xff < sVar13);
      puVar22[stride] = auVar86._0_4_;
      auVar49 = _DAT_0056aab0;
      auVar68._0_8_ = (auVar43._8_8_ >> 0x28) << 0x30;
      auVar68._8_8_ = auVar43._8_8_ >> 0x38;
      auVar56._0_8_ = uVar26 << 0x38;
      auVar56._8_8_ = uVar26 >> 8;
      auVar56 = auVar56 | auVar68;
      auVar70 = pshufb(auVar86,auVar30);
      auVar43 = pshufb(auVar56,_DAT_0056aab0);
      auVar43 = auVar43 | auVar70;
      auVar70 = pmaddubsw(auVar43,auVar27);
      auVar87 = pmaddubsw(auVar43,auVar42);
      auVar70 = phaddw(auVar70,auVar87);
      auVar70 = phaddw(auVar70,auVar70);
      auVar79._0_2_ = auVar70._0_2_ + sVar28;
      auVar79._2_2_ = auVar70._2_2_ + sVar31;
      auVar79._4_2_ = auVar70._4_2_ + sVar32;
      auVar79._6_2_ = auVar70._6_2_ + sVar33;
      auVar79._8_2_ = auVar70._8_2_ + sVar34;
      auVar79._10_2_ = auVar70._10_2_ + sVar35;
      auVar79._12_2_ = auVar70._12_2_ + sVar36;
      auVar79._14_2_ = auVar70._14_2_ + sVar37;
      auVar70 = psraw(auVar79,4);
      sVar6 = auVar70._0_2_;
      sVar7 = auVar70._2_2_;
      sVar8 = auVar70._4_2_;
      sVar9 = auVar70._6_2_;
      *(uint *)((long)puVar22 + stride * 5) =
           CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar70[6] - (0xff < sVar9),
                    CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar70[4] - (0xff < sVar8),
                             CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar70[2] - (0xff < sVar7),
                                      (0 < sVar6) * (sVar6 < 0x100) * auVar70[0] - (0xff < sVar6))))
      ;
      auVar70 = pmaddubsw(auVar43,auVar1);
      auVar43 = pmaddubsw(auVar43,auVar2);
      auVar43 = phaddw(auVar70,auVar43);
      auVar43 = phaddw(auVar43,auVar43);
      auVar80._0_2_ = auVar43._0_2_ + sVar28;
      auVar80._2_2_ = auVar43._2_2_ + sVar31;
      auVar80._4_2_ = auVar43._4_2_ + sVar32;
      auVar80._6_2_ = auVar43._6_2_ + sVar33;
      auVar80._8_2_ = auVar43._8_2_ + sVar34;
      auVar80._10_2_ = auVar43._10_2_ + sVar35;
      auVar80._12_2_ = auVar43._12_2_ + sVar36;
      auVar80._14_2_ = auVar43._14_2_ + sVar37;
      auVar43 = psraw(auVar80,4);
      sVar6 = auVar43._0_2_;
      sVar7 = auVar43._2_2_;
      sVar8 = auVar43._4_2_;
      sVar9 = auVar43._6_2_;
      auVar81._0_4_ =
           CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar43[6] - (0xff < sVar9),
                    CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar43[4] - (0xff < sVar8),
                             CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar43[2] - (0xff < sVar7),
                                      (0 < sVar6) * (sVar6 < 0x100) * auVar43[0] - (0xff < sVar6))))
      ;
      sVar10 = auVar43._8_2_;
      auVar81[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar43[8] - (0xff < sVar10);
      sVar11 = auVar43._10_2_;
      auVar81[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar43[10] - (0xff < sVar11);
      sVar12 = auVar43._12_2_;
      auVar81[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar43[0xc] - (0xff < sVar12);
      sVar13 = auVar43._14_2_;
      auVar81[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar43[0xe] - (0xff < sVar13);
      auVar81[8] = (0 < sVar6) * (sVar6 < 0x100) * auVar43[0] - (0xff < sVar6);
      auVar81[9] = (0 < sVar7) * (sVar7 < 0x100) * auVar43[2] - (0xff < sVar7);
      auVar81[10] = (0 < sVar8) * (sVar8 < 0x100) * auVar43[4] - (0xff < sVar8);
      auVar81[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar43[6] - (0xff < sVar9);
      auVar81[0xc] = (0 < sVar10) * (sVar10 < 0x100) * auVar43[8] - (0xff < sVar10);
      auVar81[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar43[10] - (0xff < sVar11);
      auVar81[0xe] = (0 < sVar12) * (sVar12 < 0x100) * auVar43[0xc] - (0xff < sVar12);
      auVar81[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar43[0xe] - (0xff < sVar13);
      *(undefined4 *)((long)puVar22 + stride * 6) = auVar81._0_4_;
      auVar43._8_8_ = auVar56._8_8_ >> 0x10;
      auVar30 = pshufb(auVar81,auVar30);
      auVar49 = pshufb(auVar56 >> 0x10,auVar49);
      auVar49 = auVar49 | auVar30;
      auVar70 = pmaddubsw(auVar49,auVar27);
      auVar30 = pmaddubsw(auVar49,auVar42);
      auVar30 = phaddw(auVar70,auVar30);
      auVar30 = phaddw(auVar30,auVar30);
      auVar69._0_2_ = auVar30._0_2_ + sVar28;
      auVar69._2_2_ = auVar30._2_2_ + sVar31;
      auVar69._4_2_ = auVar30._4_2_ + sVar32;
      auVar69._6_2_ = auVar30._6_2_ + sVar33;
      auVar69._8_2_ = auVar30._8_2_ + sVar34;
      auVar69._10_2_ = auVar30._10_2_ + sVar35;
      auVar69._12_2_ = auVar30._12_2_ + sVar36;
      auVar69._14_2_ = auVar30._14_2_ + sVar37;
      auVar30 = psraw(auVar69,4);
      sVar6 = auVar30._0_2_;
      sVar7 = auVar30._2_2_;
      sVar8 = auVar30._4_2_;
      sVar9 = auVar30._6_2_;
      *(uint *)((long)puVar22 + stride * 7) =
           CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9),
                    CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8),
                             CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar30[2] - (0xff < sVar7),
                                      (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6))))
      ;
      auVar70 = pmaddubsw(auVar49,auVar1);
      auVar30 = pmaddubsw(auVar49,auVar2);
      auVar30 = phaddw(auVar70,auVar30);
      auVar30 = phaddw(auVar30,auVar30);
      auVar57._0_2_ = auVar30._0_2_ + sVar28;
      auVar57._2_2_ = auVar30._2_2_ + sVar31;
      auVar57._4_2_ = auVar30._4_2_ + sVar32;
      auVar57._6_2_ = auVar30._6_2_ + sVar33;
      auVar57._8_2_ = auVar30._8_2_ + sVar34;
      auVar57._10_2_ = auVar30._10_2_ + sVar35;
      auVar57._12_2_ = auVar30._12_2_ + sVar36;
      auVar57._14_2_ = auVar30._14_2_ + sVar37;
      auVar30 = psraw(auVar57,4);
      sVar6 = auVar30._0_2_;
      sVar7 = auVar30._2_2_;
      sVar8 = auVar30._4_2_;
      sVar9 = auVar30._6_2_;
      puVar22[stride * 2] =
           CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9),
                    CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8),
                             CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar30[2] - (0xff < sVar7),
                                      (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6))))
      ;
      puVar22 = puVar22 + stride * 2;
    }
    if ((0x7bfbeUL >> ((ulong)tx_size & 0x3f) & 1) != 0) {
      auVar41._0_8_ = auVar43._8_8_ << 0x30;
      auVar41._8_8_ = auVar43._8_8_ >> 0x10;
      auVar30 = pshufb(ZEXT416(*puVar22) | auVar41,_DAT_0056aab0);
      auVar43 = pmaddubsw(auVar30,auVar27);
      auVar49 = pmaddubsw(auVar30,auVar42);
      auVar43 = phaddw(auVar43,auVar49);
      auVar43 = phaddw(auVar43,auVar43);
      auVar58._0_2_ = auVar43._0_2_ + sVar28;
      auVar58._2_2_ = auVar43._2_2_ + sVar31;
      auVar58._4_2_ = auVar43._4_2_ + sVar32;
      auVar58._6_2_ = auVar43._6_2_ + sVar33;
      auVar58._8_2_ = auVar43._8_2_ + sVar34;
      auVar58._10_2_ = auVar43._10_2_ + sVar35;
      auVar58._12_2_ = auVar43._12_2_ + sVar36;
      auVar58._14_2_ = auVar43._14_2_ + sVar37;
      auVar43 = psraw(auVar58,4);
      sVar6 = auVar43._0_2_;
      sVar7 = auVar43._2_2_;
      sVar8 = auVar43._4_2_;
      sVar9 = auVar43._6_2_;
      *(uint *)((long)puVar22 + stride) =
           CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar43[6] - (0xff < sVar9),
                    CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar43[4] - (0xff < sVar8),
                             CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar43[2] - (0xff < sVar7),
                                      (0 < sVar6) * (sVar6 < 0x100) * auVar43[0] - (0xff < sVar6))))
      ;
      auVar43 = pmaddubsw(auVar30,auVar1);
      auVar30 = pmaddubsw(auVar30,auVar2);
      auVar30 = phaddw(auVar43,auVar30);
      auVar30 = phaddw(auVar30,auVar30);
      auVar59._0_2_ = auVar30._0_2_ + sVar28;
      auVar59._2_2_ = auVar30._2_2_ + sVar31;
      auVar59._4_2_ = auVar30._4_2_ + sVar32;
      auVar59._6_2_ = auVar30._6_2_ + sVar33;
      auVar59._8_2_ = auVar30._8_2_ + sVar34;
      auVar59._10_2_ = auVar30._10_2_ + sVar35;
      auVar59._12_2_ = auVar30._12_2_ + sVar36;
      auVar59._14_2_ = auVar30._14_2_ + sVar37;
      auVar30 = psraw(auVar59,4);
      sVar6 = auVar30._0_2_;
      sVar7 = auVar30._2_2_;
      sVar8 = auVar30._4_2_;
      sVar9 = auVar30._6_2_;
      auVar60._0_4_ =
           CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9),
                    CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8),
                             CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar30[2] - (0xff < sVar7),
                                      (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6))))
      ;
      sVar10 = auVar30._8_2_;
      auVar60[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar30[8] - (0xff < sVar10);
      sVar11 = auVar30._10_2_;
      auVar60[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar30[10] - (0xff < sVar11);
      sVar12 = auVar30._12_2_;
      auVar60[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar30[0xc] - (0xff < sVar12);
      sVar13 = auVar30._14_2_;
      auVar60[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar30[0xe] - (0xff < sVar13);
      auVar60[8] = (0 < sVar6) * (sVar6 < 0x100) * auVar30[0] - (0xff < sVar6);
      auVar60[9] = (0 < sVar7) * (sVar7 < 0x100) * auVar30[2] - (0xff < sVar7);
      auVar60[10] = (0 < sVar8) * (sVar8 < 0x100) * auVar30[4] - (0xff < sVar8);
      auVar60[0xb] = (0 < sVar9) * (sVar9 < 0x100) * auVar30[6] - (0xff < sVar9);
      auVar60[0xc] = (0 < sVar10) * (sVar10 < 0x100) * auVar30[8] - (0xff < sVar10);
      auVar60[0xd] = (0 < sVar11) * (sVar11 < 0x100) * auVar30[10] - (0xff < sVar11);
      auVar60[0xe] = (0 < sVar12) * (sVar12 < 0x100) * auVar30[0xc] - (0xff < sVar12);
      auVar60[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar30[0xe] - (0xff < sVar13);
      *(undefined4 *)((long)puVar22 + stride * 2) = auVar60._0_4_;
      auVar43 = pshufb(auVar60,_DAT_0056aaa0);
      auVar30 = pshufb(auVar41,_DAT_0056aae0);
      auVar30 = auVar30 | auVar43;
      auVar43 = pmaddubsw(auVar30,auVar27);
      auVar27 = pmaddubsw(auVar30,auVar42);
      auVar27 = phaddw(auVar43,auVar27);
      auVar27 = phaddw(auVar27,auVar27);
      auVar48._0_2_ = auVar27._0_2_ + sVar28;
      auVar48._2_2_ = auVar27._2_2_ + sVar31;
      auVar48._4_2_ = auVar27._4_2_ + sVar32;
      auVar48._6_2_ = auVar27._6_2_ + sVar33;
      auVar48._8_2_ = auVar27._8_2_ + sVar34;
      auVar48._10_2_ = auVar27._10_2_ + sVar35;
      auVar48._12_2_ = auVar27._12_2_ + sVar36;
      auVar48._14_2_ = auVar27._14_2_ + sVar37;
      auVar27 = psraw(auVar48,4);
      sVar6 = auVar27._0_2_;
      sVar7 = auVar27._2_2_;
      sVar8 = auVar27._4_2_;
      sVar9 = auVar27._6_2_;
      *(uint *)((long)puVar22 + stride * 3) =
           CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar27[6] - (0xff < sVar9),
                    CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar27[4] - (0xff < sVar8),
                             CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar27[2] - (0xff < sVar7),
                                      (0 < sVar6) * (sVar6 < 0x100) * auVar27[0] - (0xff < sVar6))))
      ;
      auVar27 = pmaddubsw(auVar30,auVar1);
      auVar42 = pmaddubsw(auVar30,auVar2);
      auVar27 = phaddw(auVar27,auVar42);
      auVar27 = phaddw(auVar27,auVar27);
      auVar42._0_2_ = auVar27._0_2_ + sVar28;
      auVar42._2_2_ = auVar27._2_2_ + sVar31;
      auVar42._4_2_ = auVar27._4_2_ + sVar32;
      auVar42._6_2_ = auVar27._6_2_ + sVar33;
      auVar42._8_2_ = auVar27._8_2_ + sVar34;
      auVar42._10_2_ = auVar27._10_2_ + sVar35;
      auVar42._12_2_ = auVar27._12_2_ + sVar36;
      auVar42._14_2_ = auVar27._14_2_ + sVar37;
      auVar27 = psraw(auVar42,4);
      sVar6 = auVar27._0_2_;
      sVar7 = auVar27._2_2_;
      sVar8 = auVar27._4_2_;
      sVar9 = auVar27._6_2_;
      puVar22[stride] =
           CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar27[6] - (0xff < sVar9),
                    CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar27[4] - (0xff < sVar8),
                             CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar27[2] - (0xff < sVar7),
                                      (0 < sVar6) * (sVar6 < 0x100) * auVar27[0] - (0xff < sVar6))))
      ;
    }
  }
  return;
}

Assistant:

void av1_filter_intra_predictor_sse4_1(uint8_t *dst, ptrdiff_t stride,
                                       TX_SIZE tx_size, const uint8_t *above,
                                       const uint8_t *left, int mode) {
  const int bw = tx_size_wide[tx_size];
  const int bh = tx_size_high[tx_size];
  filter_intra_predictor_sse4_1(dst, stride, above, left, mode, bw, bh);
}